

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

TokenType identifier_type(Scanner *scanner)

{
  char cVar1;
  TokenType TVar2;
  Scanner *scanner_local;
  
  switch(*scanner->start) {
  case 'a':
    scanner_local._4_4_ = check_keyword(scanner,1,2,"nd",TOKEN_AND);
    break;
  default:
    scanner_local._4_4_ = TOKEN_IDENTIFIER;
    break;
  case 'e':
    scanner_local._4_4_ = check_keyword(scanner,1,3,"lse",TOKEN_ELSE);
    break;
  case 'f':
    if (1 < (long)scanner->current - (long)scanner->start) {
      cVar1 = scanner->start[1];
      if (cVar1 == 'a') {
        TVar2 = check_keyword(scanner,2,3,"lse",TOKEN_FALSE);
        return TVar2;
      }
      if (cVar1 == 'o') {
        TVar2 = check_keyword(scanner,2,1,"r",TOKEN_FOR);
        return TVar2;
      }
      if (cVar1 == 'u') {
        TVar2 = check_keyword(scanner,2,1,"n",TOKEN_FUN);
        return TVar2;
      }
    }
  case 't':
    scanner_local._4_4_ = check_keyword(scanner,1,3,"rue",TOKEN_TRUE);
    break;
  case 'i':
    scanner_local._4_4_ = check_keyword(scanner,1,1,"f",TOKEN_IF);
    break;
  case 'n':
    scanner_local._4_4_ = check_keyword(scanner,1,2,"il",TOKEN_NIL);
    break;
  case 'o':
    scanner_local._4_4_ = check_keyword(scanner,1,1,"r",TOKEN_OR);
    break;
  case 'r':
    scanner_local._4_4_ = check_keyword(scanner,1,5,"eturn",TOKEN_RETURN);
    break;
  case 'v':
    if ((1 < (long)scanner->current - (long)scanner->start) && (scanner->start[1] == 'a')) {
      if (scanner->start[2] == 'l') {
        TVar2 = check_keyword(scanner,2,1,"l",TOKEN_VAL);
        return TVar2;
      }
      if (scanner->start[2] == 'r') {
        TVar2 = check_keyword(scanner,2,1,"r",TOKEN_VAR);
        return TVar2;
      }
    }
    scanner_local._4_4_ = TOKEN_IDENTIFIER;
    break;
  case 'w':
    scanner_local._4_4_ = check_keyword(scanner,1,4,"hile",TOKEN_WHILE);
  }
  return scanner_local._4_4_;
}

Assistant:

static TokenType identifier_type(Scanner *scanner) {
    switch (*scanner->start) {
        case 'v':
            if (scanner->current - scanner->start > 1 && scanner->start[1] == 'a') {
                switch (scanner->start[2]) {
                    case 'r':
                        return check_keyword(scanner, 2, 1, "r", TOKEN_VAR);
                    case 'l':
                        return check_keyword(scanner, 2, 1, "l", TOKEN_VAL);
                    default:
                        break;
                }
            }
            break;
        case 'w':
            return check_keyword(scanner, 1, 4, "hile", TOKEN_WHILE);
        case 'i':
            return check_keyword(scanner, 1, 1, "f", TOKEN_IF);
        case 'e':
            return check_keyword(scanner, 1, 3, "lse", TOKEN_ELSE);
        case 'f':
            if (scanner->current - scanner->start > 1) {
                switch (scanner->start[1]) {
                    case 'u':
                        return check_keyword(scanner, 2, 1, "n", TOKEN_FUN);
                    case 'a':
                        return check_keyword(scanner, 2, 3, "lse", TOKEN_FALSE);
                    case 'o':
                        return check_keyword(scanner, 2, 1, "r", TOKEN_FOR);
                    default:
                        break;
                }
            }
        case 't':
            return check_keyword(scanner, 1, 3, "rue", TOKEN_TRUE);
        case 'r':
            return check_keyword(scanner, 1, 5, "eturn", TOKEN_RETURN);
        case 'n':
            return check_keyword(scanner, 1, 2, "il", TOKEN_NIL);
        case 'o':
            return check_keyword(scanner, 1, 1, "r", TOKEN_OR);
        case 'a':
            return check_keyword(scanner, 1, 2, "nd", TOKEN_AND);
        default:
            return TOKEN_IDENTIFIER;
    }

    return TOKEN_IDENTIFIER;
}